

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsForge.cpp
# Opt level: O2

void __thiscall gdsForge::gdsBoundary(gdsForge *this,gdsBOUNDARY *in_BOUNDARY,bool minimal)

{
  pointer piVar1;
  pointer piVar2;
  undefined8 uVar3;
  long lVar4;
  ulong uVar5;
  undefined7 in_register_00000011;
  ulong uVar6;
  pointer piVar7;
  int cnt;
  undefined8 uStack_70;
  int aiStack_68 [2];
  string local_60;
  undefined1 *local_40;
  int local_38;
  uint local_34 [2];
  int data [1];
  
  local_40 = (undefined1 *)aiStack_68;
  lVar4 = -(((long)(in_BOUNDARY->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(in_BOUNDARY->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start) * 2 + 0xfU & 0xfffffffffffffff0);
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cb27;
  GDSwriteRec(this,0x800);
  local_38 = (int)CONCAT71(in_register_00000011,minimal);
  if (local_38 == 0) {
    local_34[0] = in_BOUNDARY->plex;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 1;
    uVar3 = *(undefined8 *)((long)&uStack_70 + lVar4);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cb49;
    GDSwriteInt(this,0x2f03,(int *)local_34,(int)uVar3);
  }
  local_34[0] = in_BOUNDARY->layer;
  *(undefined8 *)((long)&uStack_70 + lVar4) = 1;
  cnt = (int)*(undefined8 *)((long)&uStack_70 + lVar4);
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cb6c;
  GDSwriteInt(this,0xd02,(int *)local_34,cnt);
  local_34[0] = in_BOUNDARY->dataType;
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cb87;
  GDSwriteInt(this,0xe02,(int *)local_34,cnt);
  piVar1 = (in_BOUNDARY->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar5 = (long)(in_BOUNDARY->xCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  piVar2 = (in_BOUNDARY->yCor).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (uVar6 = 0; (long)uVar5 >> 1 != uVar6; uVar6 = uVar6 + 1) {
    piVar7 = piVar2;
    if ((uVar6 & 1) == 0) {
      piVar7 = piVar1;
    }
    ((int *)((long)aiStack_68 + lVar4))[uVar6] = piVar7[uVar6 >> 1 & 0x7fffffff];
  }
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cbd7;
  GDSwriteInt(this,0x1003,(int *)((long)aiStack_68 + lVar4),(uint)(uVar5 >> 1) & 0xfffffffe);
  if ((char)local_38 == '\0') {
    local_34[0] = in_BOUNDARY->propattr;
    *(undefined8 *)((long)&uStack_70 + lVar4) = 1;
    uVar3 = *(undefined8 *)((long)&uStack_70 + lVar4);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cbf7;
    GDSwriteInt(this,0x2b02,(int *)local_34,(int)uVar3);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cc0a;
    std::__cxx11::string::string((string *)&local_60,(string *)&in_BOUNDARY->propvalue);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cc1a;
    GDSwriteStr(this,0x2c06,&local_60);
    *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cc23;
    std::__cxx11::string::~string((string *)&local_60);
  }
  *(undefined8 *)((long)&uStack_70 + lVar4) = 0x10cc30;
  GDSwriteRec(this,0x1100);
  return;
}

Assistant:

void gdsForge::gdsBoundary(const gdsBOUNDARY &in_BOUNDARY, bool minimal)
{
  int data[1];
  int corXY[in_BOUNDARY.xCor.size() * 2];

  this->GDSwriteRec(GDS_BOUNDARY);

  // ELFLAGS and PLEX are optional
  if (minimal == false) { // false
    data[0] = in_BOUNDARY.plex;
    this->GDSwriteInt(GDS_PLEX, data, 1);
  }

  // Layer number, 0 to 63
  data[0] = in_BOUNDARY.layer;
  this->GDSwriteInt(GDS_LAYER, data, 1);

  // unimportant, set to zero.
  data[0] = in_BOUNDARY.dataType;
  this->GDSwriteInt(GDS_DATATYPE, data, 1);

  // XY coordinates
  // boundary must be closed, first and last coordinate must be the same
  // minimum of 4 points(triangle)

  for (int i = 0; i < in_BOUNDARY.xCor.size() * 2; i++) {
    if (i % 2) {
      // cout << "corY[" << i/2  << "]: " << corY[i/2] << endl;
      corXY[i] = in_BOUNDARY.yCor[i / 2];
    } else {
      // cout << "corX[" << i/2  << "]: " << corX[i/2] << endl;
      corXY[i] = in_BOUNDARY.xCor[i / 2];
    }
  }

  this->GDSwriteInt(GDS_XY, corXY, in_BOUNDARY.xCor.size() * 2);

  // Optional goodies
  if (minimal == false) { // false
    data[0] = in_BOUNDARY.propattr;
    this->GDSwriteInt(GDS_PROPATTR, data, 1);

    this->GDSwriteStr(GDS_PROPVALUE, in_BOUNDARY.propvalue);
  }

  this->GDSwriteRec(GDS_ENDEL);
}